

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

char * uloc_toLegacyKey_63(char *keyword)

{
  char c;
  UBool UVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = ulocimp_toLegacyKey_63(keyword);
  if ((pcVar2 == (char *)0x0) && (c = *keyword, pcVar2 = keyword, c != '\0')) {
    pcVar3 = keyword + 1;
    do {
      UVar1 = uprv_isASCIILetter_63(c);
      if ((UVar1 == '\0') && (9 < (byte)(pcVar3[-1] - 0x30U))) {
        return (char *)0x0;
      }
      c = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (c != '\0');
  }
  return pcVar2;
}

Assistant:

U_CAPI const char* U_EXPORT2
uloc_toLegacyKey(const char* keyword)
{
    const char* legacyKey = ulocimp_toLegacyKey(keyword);
    if (legacyKey == NULL) {
        // Checks if the specified locale key is well-formed with the legacy locale syntax.
        //
        // Note:
        //  LDML/CLDR provides some definition of keyword syntax in
        //  * http://www.unicode.org/reports/tr35/#Unicode_locale_identifier and
        //  * http://www.unicode.org/reports/tr35/#Old_Locale_Extension_Syntax
        //  Keys can only consist of [0-9a-zA-Z].
        if (isWellFormedLegacyKey(keyword)) {
            return keyword;
        }
    }
    return legacyKey;
}